

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O3

int __thiscall Move::input_move(Move *this)

{
  int iVar1;
  undefined1 *puVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  istream *piVar6;
  long *plVar7;
  long lVar8;
  int p;
  int j;
  int i;
  string ss;
  string sss;
  string acr;
  stringstream line;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  char *local_1d8;
  char *local_1d0;
  char local_1c8 [16];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = 0;
  cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '`');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_1f8,cVar4);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
  iVar5 = 0;
  local_210 = 0;
  local_208[0] = 0;
  local_1d0 = (char *)0x0;
  local_1c8[0] = '\0';
  local_218 = local_208;
  local_1d8 = local_1c8;
  piVar6 = std::operator>>((istream *)local_1b8,(string *)&local_218);
  if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_0010c630;
  iVar5 = std::__cxx11::string::compare((char *)&local_218);
  if (iVar5 == 0) {
    iVar5 = -1;
    goto LAB_0010c630;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_218);
  if (iVar5 == 0) {
    iVar5 = 2;
    std::operator>>((istream *)local_1b8,(string *)&this->swap_letters);
    goto LAB_0010c630;
  }
  plVar7 = (long *)std::istream::operator>>((istream *)local_1b8,&local_220);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
    plVar7 = (long *)std::istream::operator>>((istream *)local_1b8,&local_224);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) goto LAB_0010c701;
  }
  else {
LAB_0010c701:
    local_224 = (this->bsize - (this->bsize + 1 >> 0x1f)) + 1 >> 1;
    local_220 = local_224;
  }
  piVar6 = std::operator>>((istream *)local_1b8,(string *)&local_1d8);
  if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
    std::__cxx11::string::_M_replace((ulong)&local_1d8,0,local_1d0,0x10f22e);
  }
  plVar7 = (long *)std::istream::operator>>((istream *)local_1b8,&local_228);
  lVar3 = local_210;
  puVar2 = local_218;
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    local_228 = -1;
  }
  if (local_210 != 0) {
    lVar8 = 0;
    do {
      iVar5 = toupper((int)(char)puVar2[lVar8]);
      puVar2[lVar8] = (char)iVar5;
      lVar8 = lVar8 + 1;
    } while (lVar3 != lVar8);
  }
  iVar1 = local_220;
  iVar5 = local_224;
  cVar4 = *local_1d8;
  local_21c = local_228;
  std::__cxx11::string::_M_assign((string *)this);
  this->length = (int)local_210;
  this->row = iVar1;
  this->col = iVar5;
  this->across = cVar4 != 'd';
  this->score = 0;
  this->blank_pos = local_21c;
  this->heur_score = 0;
  iVar5 = 1;
LAB_0010c630:
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  return iVar5;
}

Assistant:

int input_move() {
        std::string sss;
        getline(std::cin, sss);
        std::stringstream line{sss};
        int i, j, p;
        std::string ss, acr;
        if (!(line >> ss)) return 0;
        if (ss == ".") return -1;
        if (ss == "!") {
            line >> this->swap_letters;
            return 2;
        }
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        set_all(ss, i, j, acr[0] != 'd', 0, p);
        return 1;
    }